

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

uint64_t poly_mod_descriptor_checksum(uint64_t c,int val)

{
  ulong uVar1;
  uint8_t c0;
  ulong uStack_10;
  int val_local;
  uint64_t c_local;
  
  uVar1 = c >> 0x23;
  uStack_10 = (c & 0x7ffffffff) << 5 ^ (long)val;
  if ((uVar1 & 1) != 0) {
    uStack_10 = uStack_10 ^ 0xf5dee51989;
  }
  if ((uVar1 & 2) != 0) {
    uStack_10 = uStack_10 ^ 0xa9fdca3312;
  }
  if ((uVar1 & 4) != 0) {
    uStack_10 = uStack_10 ^ 0x1bab10e32d;
  }
  if ((uVar1 & 8) != 0) {
    uStack_10 = uStack_10 ^ 0x3706b1677a;
  }
  if ((uVar1 & 0x10) != 0) {
    uStack_10 = uStack_10 ^ 0x644d626ffd;
  }
  return uStack_10;
}

Assistant:

static uint64_t poly_mod_descriptor_checksum(uint64_t c, int val)
{
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
}